

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  ulong uVar1;
  pointer paVar2;
  PyObject *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Bit_pointer puVar6;
  bool bVar7;
  argument_record aVar8;
  bool bVar9;
  int iVar10;
  function_record *pfVar11;
  type_info *find_type;
  long lVar12;
  handle hVar13;
  long lVar14;
  pointer pfVar15;
  _Bit_type *p_Var16;
  ushort uVar17;
  uint uVar18;
  PyObject *tmp;
  ulong uVar19;
  ulong uVar20;
  _Bit_type *p_Var21;
  ulong uVar22;
  PyTypeObject **value;
  size_type __new_size;
  char *__s;
  ulong uVar23;
  pointer pfVar24;
  function_record *pfVar25;
  pointer paVar26;
  pointer pfVar27;
  reference rVar28;
  anon_class_1_0_00000001 append_note_if_missing_header_is_suspected;
  handle arg;
  handle hStack_1c0;
  undefined1 auStack_1b8 [16];
  _Bit_pointer local_1a8;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  PyObject *local_168;
  dict kwargs_1;
  dict kwargs;
  instance *pi;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  loader_life_support guard_1;
  undefined1 auStack_e0 [24];
  undefined1 local_c8 [16];
  pointer local_b8;
  handle hStack_b0;
  _Bit_pointer local_a8;
  object local_a0;
  object local_98 [2];
  handle local_88;
  function_record *local_80;
  ulong local_78;
  allocator<char> local_70 [8];
  value_and_holder local_68;
  PyTypeObject **local_48;
  handle local_40 [2];
  
  pfVar11 = (function_record *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                  ,0x227,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar1 = args_in[1].ob_refcnt;
  if (uVar1 == 0) {
    pi = (instance *)0x0;
  }
  else {
    pi = (instance *)args_in[1].ob_type;
  }
  local_68.type = (type_info *)0x0;
  local_68.vh = (void **)0x0;
  local_68.inst = (instance *)0x0;
  local_68.index = 0;
  if ((pfVar11->field_0x59 & 1) != 0) {
    iVar10 = _PyObject_TypeCheck(&pi->ob_base,(PyTypeObject *)(pfVar11->scope).m_ptr);
    if (iVar10 == 0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    find_type = detail::get_type_info((PyTypeObject *)(pfVar11->scope).m_ptr);
    detail::instance::get_value_and_holder((value_and_holder *)&guard_1,pi,find_type,true);
    local_68.type = (type_info *)auStack_e0._8_8_;
    local_68.vh = (void **)auStack_e0._16_8_;
    local_68.inst = (instance *)_guard_1;
    local_68.index = auStack_e0._0_8_;
    bVar7 = detail::value_and_holder::instance_registered(&local_68);
    if (bVar7) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      _guard_1 = (pointer)0x0;
      object::~object((object *)&guard_1);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = pfVar11->next;
  local_48 = &args_in[1].ob_type;
  local_168 = (PyObject *)0x1;
  for (pfVar25 = pfVar11; pfVar25 != (function_record *)0x0; pfVar25 = pfVar25->next) {
    uVar18 = (*(ushort *)&pfVar25->field_0x59 & 0x20) >> 5;
    local_78 = (long)(short)((uint)(int)(short)(*(ushort *)&pfVar25->field_0x59 << 9) >> 0xf) +
               ((ulong)pfVar25->nargs - (ulong)uVar18);
    uVar19 = local_78 - pfVar25->nargs_kw_only;
    if (((uVar18 != 0) || (uVar1 <= uVar19)) &&
       ((uVar19 <= uVar1 ||
        (uVar19 <= (ulong)((long)(pfVar25->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pfVar25->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5))))) {
      detail::function_call::function_call((function_call *)&guard_1,pfVar25,(handle)pi);
      uVar20 = uVar19;
      if (uVar1 < uVar19) {
        uVar20 = uVar1;
      }
      if ((pfVar25->field_0x59 & 2) == 0) {
        uVar23 = 0;
      }
      else {
        if (*(PyObject **)local_68.vh != (PyObject *)0x0) {
          (*(local_68.type)->dealloc)(&local_68);
        }
        if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                        ,0x274,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_88.m_ptr = (PyObject *)args_in[1].ob_type;
        arg.m_ptr = (PyObject *)&local_68;
        std::vector<pybind11::handle,std::allocator<pybind11::handle>>::emplace_back<_object*>
                  ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_e0,
                   &arg.m_ptr);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_c8,false);
        uVar23 = 1;
      }
      uVar22 = (ulong)(uint)((int)uVar23 << 5);
      lVar14 = uVar22 + 0x18;
      for (; uVar23 < uVar20; uVar23 = uVar23 + 1) {
        paVar2 = (pfVar25->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar23 < (ulong)((long)(pfVar25->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 5))
        {
          paVar26 = paVar2 + uVar22;
          bVar7 = paVar2 != (pointer)0x0;
          if ((((kwargs_in == (PyObject *)0x0) || (paVar2 == (pointer)0x0)) ||
              (bVar7 = true, *(long *)paVar26 == 0)) ||
             (lVar12 = PyDict_GetItemString(kwargs_in), lVar12 == 0)) goto LAB_0010d911;
LAB_0010db1c:
          bVar7 = false;
          goto LAB_0010ded5;
        }
        bVar7 = false;
        paVar26 = (pointer)0x0;
LAB_0010d911:
        if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                        ,0x283,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        arg.m_ptr = (PyObject *)(&args_in[1].ob_type)[uVar23];
        if (((bVar7) && (((byte)paVar26[0x18] & 2) == 0)) &&
           ((PyTypeObject *)arg.m_ptr == (PyTypeObject *)&_Py_NoneStruct)) goto LAB_0010db1c;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_e0,&arg);
        aVar8 = (argument_record)0x1;
        if (bVar7) {
          aVar8 = paVar26[0x18];
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_c8,(bool)((byte)aVar8 & 1));
        uVar22 = uVar22 + 0x20;
        lVar14 = lVar14 + 0x20;
      }
      if (kwargs_in != (PyObject *)0x0) {
        kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      }
      uVar22 = (ulong)pfVar25->nargs_pos_only;
      kwargs.super_object.super_handle.m_ptr = (object)(object)kwargs_in;
      if (uVar23 < uVar22) {
        for (; uVar23 < uVar22; uVar23 = uVar23 + 1) {
          paVar2 = (pfVar25->args).
                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          arg.m_ptr = (PyObject *)0x0;
          pPVar3 = *(PyObject **)(paVar2 + lVar14 + -8);
          if (pPVar3 == (PyObject *)0x0) goto LAB_0010db5e;
          arg.m_ptr = pPVar3;
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_e0,&arg)
          ;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c8,
                     (bool)((byte)paVar2[lVar14] & 1));
          uVar22 = (ulong)pfVar25->nargs_pos_only;
          lVar14 = lVar14 + 0x20;
        }
      }
      if (uVar23 < local_78) {
        uVar22 = uVar23 << 5 | 0x18;
        bVar7 = false;
        for (; uVar23 < local_78; uVar23 = uVar23 + 1) {
          paVar2 = (pfVar25->args).
                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          arg.m_ptr = (PyObject *)0x0;
          if (((kwargs_in == (PyObject *)0x0) || (*(long *)(paVar2 + (uVar22 - 0x18)) == 0)) ||
             (arg.m_ptr = (PyObject *)PyDict_GetItemString(kwargs.super_object.super_handle.m_ptr),
             arg.m_ptr == (PyObject *)0x0)) {
            if (*(PyObject **)(paVar2 + (uVar22 - 8)) != (PyObject *)0x0) {
              arg.m_ptr = *(PyObject **)(paVar2 + (uVar22 - 8));
            }
          }
          else {
            if (!bVar7) {
              second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)PyDict_Copy(kwargs.super_object.super_handle.m_ptr);
              object::operator=(&kwargs.super_object,(object *)&second_pass_convert);
              object::~object((object *)&second_pass_convert);
            }
            bVar7 = true;
            PyDict_DelItemString
                      (kwargs.super_object.super_handle.m_ptr,
                       *(undefined8 *)(paVar2 + (uVar22 - 0x18)));
          }
          if ((((byte)paVar2[uVar22] & 2) == 0 && arg.m_ptr == (PyObject *)&_Py_NoneStruct) ||
             (arg.m_ptr == (PyObject *)0x0)) {
            bVar7 = false;
            goto LAB_0010dec8;
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_e0,&arg)
          ;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c8,
                     (bool)((byte)paVar2[uVar22] & 1));
          uVar22 = uVar22 + 0x20;
        }
      }
      if ((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) {
        uVar17 = *(ushort *)&pfVar25->field_0x59;
LAB_0010db6a:
        if ((uVar17 & 0x20) != 0) {
          tuple::tuple((tuple *)&second_pass_convert,0);
          if (uVar20 == 0) {
            args_in->ob_refcnt = args_in->ob_refcnt + 1;
            arg.m_ptr = args_in;
LAB_0010dc45:
            object::operator=((object *)&second_pass_convert,(object *)&arg);
            object::~object((object *)&arg);
          }
          else {
            pfVar24 = (pointer)(uVar1 - uVar23);
            if (uVar1 < uVar23 || pfVar24 == (pointer)0x0) {
              tuple::tuple((tuple *)&arg,0);
              goto LAB_0010dc45;
            }
            tuple::tuple((tuple *)&arg,(size_t)pfVar24);
            object::operator=((object *)&second_pass_convert,(object *)&arg);
            object::~object((object *)&arg);
            value = local_48 + uVar23;
            pfVar15 = (pointer)0x0;
            while (pfVar27 = pfVar15, pfVar24 != pfVar27) {
              if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/pybind11/include/pybind11/pybind11.h"
                              ,0x2dc,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              hStack_1c0.m_ptr =
                   (PyObject *)
                   second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              auStack_1b8._8_8_ = (PyObject *)0x0;
              detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&arg,
                         (_object **)value);
              object::~object((object *)(auStack_1b8 + 8));
              value = value + 1;
              auStack_1b8._0_8_ = pfVar27;
              pfVar15 = (pointer)((long)&pfVar27->func + 1);
            }
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_e0,
                     (value_type *)&second_pass_convert);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c8,false);
          object::operator=(&local_a0,(object *)&second_pass_convert);
          object::~object((object *)&second_pass_convert);
          uVar17 = *(ushort *)&pfVar25->field_0x59;
        }
        if ((uVar17 & 0x40) != 0) {
          if ((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) {
            dict::dict((dict *)&arg);
            object::operator=(&kwargs.super_object,(object *)&arg);
            object::~object((object *)&arg);
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_e0,
                     (value_type *)&kwargs);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c8,false);
          object::operator=(local_98,&kwargs.super_object);
        }
        __new_size = (long)(auStack_e0._8_8_ - auStack_e0._0_8_) >> 3;
        if ((__new_size != pfVar25->nargs) ||
           (((ulong)hStack_b0.m_ptr & 0xffffffff) + ((long)local_b8 - local_c8._0_8_) * 8 !=
            __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        if (local_80 != (function_record *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize(&second_pass_convert,__new_size,false);
          puVar6 = local_a8;
          hVar13.m_ptr = hStack_b0.m_ptr;
          pfVar24 = local_b8;
          uVar5 = local_c8._8_8_;
          uVar4 = local_c8._0_8_;
          local_1a8 = local_a8;
          auStack_1b8._0_8_ = local_b8;
          auStack_1b8._8_8_ = hStack_b0.m_ptr;
          arg.m_ptr = (PyObject *)local_c8._0_8_;
          hStack_1c0.m_ptr = (PyObject *)local_c8._8_8_;
          local_a8 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_b8 = (pointer)second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_b0.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_c8._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_c8._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar6;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)pfVar24;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar13.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar5;
        }
        detail::loader_life_support::loader_life_support((loader_life_support *)&arg);
        local_168 = (PyObject *)(*pfVar25->impl)((function_call *)&guard_1);
        detail::loader_life_support::~loader_life_support((loader_life_support *)&arg);
        bVar7 = local_168 != (PyObject *)0x1;
        if (local_80 != (function_record *)0x0 && !bVar7) {
          uVar20 = (ulong)(*(ushort *)&pfVar25->field_0x59 >> 4 & 1);
          do {
            if (uVar19 <= uVar20) goto LAB_0010debc;
            rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&second_pass_convert,uVar20);
            puVar6 = local_a8;
            hVar13.m_ptr = hStack_b0.m_ptr;
            pfVar24 = local_b8;
            uVar5 = local_c8._8_8_;
            uVar4 = local_c8._0_8_;
            uVar20 = uVar20 + 1;
          } while ((*rVar28._M_p & rVar28._M_mask) == 0);
          local_1a8 = local_a8;
          auStack_1b8._0_8_ = local_b8;
          auStack_1b8._8_8_ = hStack_b0.m_ptr;
          arg.m_ptr = (PyObject *)local_c8._0_8_;
          hStack_1c0.m_ptr = (PyObject *)local_c8._8_8_;
          local_a8 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_b8 = (pointer)second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_b0.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_c8._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_c8._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar6;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)pfVar24;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar13.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar5;
          std::
          vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ::emplace_back<pybind11::detail::function_call>(&second_pass,(function_call *)&guard_1);
LAB_0010debc:
          bVar7 = false;
        }
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&second_pass_convert.super__Bvector_base<std::allocator<bool>_>);
      }
      else {
        bVar7 = dict::empty(&kwargs);
        uVar17 = *(ushort *)&pfVar25->field_0x59;
        if (bVar7 || (char)((uVar17 & 0x40) >> 6) != '\0') goto LAB_0010db6a;
LAB_0010db5e:
        bVar7 = false;
      }
LAB_0010dec8:
      object::~object(&kwargs.super_object);
LAB_0010ded5:
      detail::function_call::~function_call((function_call *)&guard_1);
      if (bVar7) break;
    }
  }
  pfVar24 = second_pass.
            super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  hVar13.m_ptr = local_168;
  if (((local_80 != (function_record *)0x0) &&
      (second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && (local_168 == (PyObject *)0x1)) {
    local_168 = (PyObject *)0x1;
    for (pfVar15 = second_pass.
                   super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                   ._M_impl.super__Vector_impl_data._M_start; hVar13.m_ptr = local_168,
        pfVar15 != pfVar24; pfVar15 = pfVar15 + 1) {
      detail::loader_life_support::loader_life_support(&guard_1);
      hVar13 = (*pfVar15->func->impl)(pfVar15);
      detail::loader_life_support::~loader_life_support(&guard_1);
      if (hVar13.m_ptr != (PyObject *)0x1) break;
    }
  }
  local_168 = hVar13.m_ptr;
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector(&second_pass);
  if (local_168 == (PyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&guard_1,
               "Unable to convert function return value to a Python type! The signature was\n\t",
               (allocator<char> *)&arg);
    std::__cxx11::string::append((char *)&guard_1);
    dispatcher::anon_class_1_0_00000001::operator()
              (&append_note_if_missing_header_is_suspected,(string *)&guard_1);
    PyErr_SetString(_PyExc_TypeError,_guard_1);
  }
  else {
    if (local_168 != (PyObject *)0x1) {
      if ((pfVar11->field_0x59 & 1) == 0) {
        return local_168;
      }
      bVar7 = detail::value_and_holder::holder_constructed(&local_68);
      if (!bVar7) {
        (*(local_68.type)->init_instance)(pi,(void *)0x0);
        return local_168;
      }
      return local_168;
    }
    if ((pfVar11->field_0x59 & 8) != 0) {
      __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
      return (PyObject *)&_Py_NotImplementedStruct;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&second_pass,pfVar11->name,(allocator<char> *)&kwargs_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&second_pass
                   ,"(): incompatible ");
    __s = "function";
    if ((pfVar11->field_0x59 & 1) != 0) {
      __s = "constructor";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&kwargs,__s,local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kwargs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&guard_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                   " arguments. The following argument types are supported:\n");
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::~string((string *)&kwargs);
    std::__cxx11::string::~string((string *)&second_pass_convert);
    std::__cxx11::string::~string((string *)&second_pass);
    iVar10 = 1;
    for (pfVar25 = pfVar11; pfVar25 != (function_record *)0x0; pfVar25 = pfVar25->next) {
      std::__cxx11::to_string((string *)&second_pass,iVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,"    ",(string *)&second_pass);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,". ");
      std::__cxx11::string::append((string *)&guard_1);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&second_pass_convert);
      std::__cxx11::string::~string((string *)&second_pass);
      if ((pfVar11->field_0x59 & 1) == 0) {
LAB_0010e271:
        std::__cxx11::string::append((char *)&guard_1);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arg,pfVar25->signature,(allocator<char> *)&second_pass_convert);
        lVar14 = std::__cxx11::string::find
                           ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&arg,0x28);
        pfVar24 = (pointer)(lVar14 + 7);
        if (hStack_1c0.m_ptr <= pfVar24) {
LAB_0010e264:
          std::__cxx11::string::~string((string *)&arg);
          goto LAB_0010e271;
        }
        pfVar15 = (pointer)std::__cxx11::string::find((char *)&arg,0x195900);
        std::__cxx11::string::rfind((char *)&arg,0x195d9d);
        if (pfVar15 < hStack_1c0.m_ptr) {
          pfVar27 = (pointer)((long)&pfVar15->func + 2);
        }
        else {
          pfVar15 = (pointer)std::__cxx11::string::find((char)&arg,0x29);
          pfVar27 = pfVar15;
        }
        if ((pfVar15 <= pfVar24) || (hStack_1c0.m_ptr <= pfVar27)) goto LAB_0010e264;
        std::__cxx11::string::append((string *)&guard_1,(ulong)&arg,(ulong)pfVar24);
        std::__cxx11::string::push_back((char)(string *)&guard_1);
        std::__cxx11::string::append((string *)&guard_1,(ulong)&arg,(ulong)pfVar27);
        std::__cxx11::string::~string((string *)&arg);
      }
      std::__cxx11::string::append((char *)&guard_1);
      iVar10 = iVar10 + 1;
    }
    std::__cxx11::string::append((char *)&guard_1);
    args_in->ob_refcnt = args_in->ob_refcnt + 1;
    bVar7 = false;
    kwargs.super_object.super_handle.m_ptr = (object)(object)args_in;
    for (p_Var21 = (_Bit_type *)(ulong)(*(ushort *)&pfVar11->field_0x59 & 1);
        p_Var16 = (_Bit_type *)PyTuple_Size(kwargs.super_object.super_handle.m_ptr),
        p_Var21 < p_Var16; p_Var21 = (_Bit_type *)((long)p_Var21 + 1)) {
      bVar9 = true;
      if (bVar7) {
        std::__cxx11::string::append((char *)&guard_1);
        bVar9 = bVar7;
      }
      bVar7 = bVar9;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           kwargs.super_object.super_handle.m_ptr;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var21;
      detail::accessor::operator_cast_to_object((accessor *)&kwargs_1);
      repr((pybind11 *)&second_pass,(handle)kwargs_1.super_object.super_handle.m_ptr);
      str::operator_cast_to_string((string *)&arg,(str *)&second_pass);
      std::__cxx11::string::append((string *)&guard_1);
      std::__cxx11::string::~string((string *)&arg);
      object::~object((object *)&second_pass);
      object::~object((object *)&kwargs_1);
      object::~object((object *)
                      &second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    }
    if (kwargs_in != (PyObject *)0x0) {
      kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      kwargs_1.super_object.super_handle.m_ptr = (object)(object)kwargs_in;
      bVar9 = dict::empty(&kwargs_1);
      if (!bVar9) {
        if (bVar7) {
          std::__cxx11::string::append((char *)&guard_1);
        }
        std::__cxx11::string::append((char *)&guard_1);
        dict::begin((dict_iterator *)&arg,&kwargs_1);
        bVar7 = true;
        while ((PyObject *)auStack_1b8._8_8_ != (PyObject *)0xffffffffffffffff) {
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)hStack_1c0.m_ptr;
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_1b8._0_8_;
          if (!bVar7) {
            std::__cxx11::string::append((char *)&guard_1);
          }
          str::str((str *)local_40,"{}=");
          str::format<pybind11::handle&>((str *)local_70,local_40);
          str::operator_cast_to_string((string *)&second_pass_convert,(str *)local_70);
          std::__cxx11::string::append((string *)&guard_1);
          std::__cxx11::string::~string((string *)&second_pass_convert);
          object::~object((object *)local_70);
          object::~object((object *)local_40);
          repr((pybind11 *)local_70,
               (handle)second_pass.
                       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          str::operator_cast_to_string((string *)&second_pass_convert,(str *)local_70);
          std::__cxx11::string::append((string *)&guard_1);
          std::__cxx11::string::~string((string *)&second_pass_convert);
          object::~object((object *)local_70);
          bVar7 = false;
          detail::iterator_policies::dict_readonly::increment((dict_readonly *)&arg);
        }
      }
      object::~object(&kwargs_1.super_object);
    }
    dispatcher::anon_class_1_0_00000001::operator()
              (&append_note_if_missing_header_is_suspected,(string *)&guard_1);
    PyErr_SetString(_PyExc_TypeError,_guard_1);
    object::~object(&kwargs.super_object);
  }
  std::__cxx11::string::~string((string *)&guard_1);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg_rec.name);
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }